

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neverbleed.c
# Opt level: O3

void * daemon_conn_thread(void *_sock_fd)

{
  undefined8 uVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  void *pvVar5;
  int iVar6;
  int *piVar7;
  void *pvVar8;
  RSA *pRVar9;
  EVP_PKEY *pEVar10;
  EC_KEY **ppEVar11;
  size_t sVar12;
  EC_KEY *pEVar13;
  EC_GROUP *pEVar14;
  BIGNUM *a;
  BIGNUM *pBVar15;
  uchar *puVar16;
  ulong *puVar17;
  int __fd;
  code *func;
  uchar *__src;
  char *pcVar18;
  char *pcVar19;
  ulong uVar20;
  undefined8 uVar21;
  EC_POINT *__s;
  size_t sVar22;
  long lVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  expbuf_t buf;
  BIGNUM *e;
  uchar auth_token [32];
  char errbuf [256];
  undefined1 local_10c8 [16];
  undefined1 local_10b8 [16];
  EC_POINT *local_10a8;
  char *local_10a0;
  RSA *local_1098;
  uint local_1090;
  undefined4 uStack_108c;
  BIGNUM *local_1088;
  void *local_1080;
  EVP_PKEY *local_1078;
  EC_GROUP *local_1070;
  FILE *local_1068;
  BIGNUM *local_1060;
  uchar local_1058;
  uchar uStack_1057;
  uchar uStack_1056;
  uchar uStack_1055;
  uchar uStack_1054;
  uchar uStack_1053;
  uchar uStack_1052;
  uchar uStack_1051;
  uchar uStack_1050;
  uchar uStack_104f;
  uchar uStack_104e;
  uchar uStack_104d;
  uchar uStack_104c;
  uchar uStack_104b;
  uchar uStack_104a;
  uchar uStack_1049;
  uchar local_1048;
  uchar uStack_1047;
  uchar uStack_1046;
  uchar uStack_1045;
  uchar uStack_1044;
  uchar uStack_1043;
  uchar uStack_1042;
  uchar uStack_1041;
  uchar uStack_1040;
  uchar uStack_103f;
  uchar uStack_103e;
  uchar uStack_103d;
  uchar uStack_103c;
  uchar uStack_103b;
  uchar uStack_103a;
  uchar uStack_1039;
  uchar local_1038 [24];
  undefined5 uStack_1020;
  undefined3 local_101b;
  undefined5 uStack_1018;
  char acStack_1013 [4067];
  
  local_10b8 = (undefined1  [16])0x0;
  local_10c8 = (undefined1  [16])0x0;
  iVar6 = read_nbytes((int)_sock_fd,&local_1058,0x20);
  if (iVar6 == 0) {
    auVar25[0] = -((daemon_vars.nb)->auth_token[0x10] == local_1048);
    auVar25[1] = -((daemon_vars.nb)->auth_token[0x11] == uStack_1047);
    auVar25[2] = -((daemon_vars.nb)->auth_token[0x12] == uStack_1046);
    auVar25[3] = -((daemon_vars.nb)->auth_token[0x13] == uStack_1045);
    auVar25[4] = -((daemon_vars.nb)->auth_token[0x14] == uStack_1044);
    auVar25[5] = -((daemon_vars.nb)->auth_token[0x15] == uStack_1043);
    auVar25[6] = -((daemon_vars.nb)->auth_token[0x16] == uStack_1042);
    auVar25[7] = -((daemon_vars.nb)->auth_token[0x17] == uStack_1041);
    auVar25[8] = -((daemon_vars.nb)->auth_token[0x18] == uStack_1040);
    auVar25[9] = -((daemon_vars.nb)->auth_token[0x19] == uStack_103f);
    auVar25[10] = -((daemon_vars.nb)->auth_token[0x1a] == uStack_103e);
    auVar25[0xb] = -((daemon_vars.nb)->auth_token[0x1b] == uStack_103d);
    auVar25[0xc] = -((daemon_vars.nb)->auth_token[0x1c] == uStack_103c);
    auVar25[0xd] = -((daemon_vars.nb)->auth_token[0x1d] == uStack_103b);
    auVar25[0xe] = -((daemon_vars.nb)->auth_token[0x1e] == uStack_103a);
    auVar25[0xf] = -((daemon_vars.nb)->auth_token[0x1f] == uStack_1039);
    auVar24[0] = -((daemon_vars.nb)->auth_token[0] == local_1058);
    auVar24[1] = -((daemon_vars.nb)->auth_token[1] == uStack_1057);
    auVar24[2] = -((daemon_vars.nb)->auth_token[2] == uStack_1056);
    auVar24[3] = -((daemon_vars.nb)->auth_token[3] == uStack_1055);
    auVar24[4] = -((daemon_vars.nb)->auth_token[4] == uStack_1054);
    auVar24[5] = -((daemon_vars.nb)->auth_token[5] == uStack_1053);
    auVar24[6] = -((daemon_vars.nb)->auth_token[6] == uStack_1052);
    auVar24[7] = -((daemon_vars.nb)->auth_token[7] == uStack_1051);
    auVar24[8] = -((daemon_vars.nb)->auth_token[8] == uStack_1050);
    auVar24[9] = -((daemon_vars.nb)->auth_token[9] == uStack_104f);
    auVar24[10] = -((daemon_vars.nb)->auth_token[10] == uStack_104e);
    auVar24[0xb] = -((daemon_vars.nb)->auth_token[0xb] == uStack_104d);
    auVar24[0xc] = -((daemon_vars.nb)->auth_token[0xc] == uStack_104c);
    auVar24[0xd] = -((daemon_vars.nb)->auth_token[0xd] == uStack_104b);
    auVar24[0xe] = -((daemon_vars.nb)->auth_token[0xe] == uStack_104a);
    auVar24[0xf] = -((daemon_vars.nb)->auth_token[0xf] == uStack_1049);
    auVar24 = auVar24 & auVar25;
    if ((ushort)((ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar24[0xf] >> 7) << 0xf) == 0xffff) {
      iVar6 = expbuf_read((expbuf_t *)local_10c8,(int)_sock_fd);
      pvVar5 = _sock_fd;
      pvVar8 = local_1080;
      while (local_1080 = pvVar5, __fd = (int)_sock_fd, iVar6 == 0) {
        pcVar18 = (char *)local_10c8._8_8_;
        uVar21 = local_10b8._0_8_;
        pvVar8 = memchr((void *)local_10c8._8_8_,0,local_10b8._0_8_ - local_10c8._8_8_);
        if (pvVar8 == (void *)0x0) {
LAB_0018a668:
          piVar7 = __errno_location();
          *piVar7 = 0;
          pcVar18 = "failed to parse request";
          goto LAB_0018a696;
        }
        pcVar19 = (char *)((long)pvVar8 + 1);
        local_10c8._8_8_ = pcVar19;
        if (pcVar18 == (char *)0x0) goto LAB_0018a668;
        iVar6 = strcmp(pcVar18,"priv_enc");
        if (iVar6 == 0) {
          pcVar18 = "priv_enc_stub";
          func = RSA_private_encrypt;
LAB_00189c3c:
          iVar6 = priv_encdec_stub(pcVar18,func,(expbuf_t *)local_10c8);
LAB_00189c44:
          if (iVar6 != 0) goto LAB_0018a69d;
        }
        else {
          iVar6 = strcmp(pcVar18,"priv_dec");
          if (iVar6 == 0) {
            pcVar18 = "priv_dec_stub";
            func = RSA_private_decrypt;
            goto LAB_00189c3c;
          }
          iVar6 = strcmp(pcVar18,"sign");
          if (iVar6 == 0) {
            local_1090 = 0;
            if (7 < (ulong)(uVar21 - (long)pcVar19)) {
              uVar1 = *(undefined8 *)((long)pvVar8 + 1);
              local_10c8._8_8_ = (long)pvVar8 + 9;
              if (7 < (ulong)(uVar21 - ((long)pvVar8 + 9))) {
                uVar20 = *(ulong *)((long)pvVar8 + 9);
                puVar16 = (uchar *)((long)pvVar8 + 0x11);
                local_10c8._8_8_ = puVar16;
                if (uVar20 <= (ulong)(uVar21 - (long)puVar16)) {
                  local_10c8._8_8_ = puVar16 + uVar20;
                  if (7 < (ulong)(uVar21 - local_10c8._8_8_)) {
                    sVar22 = *(size_t *)local_10c8._8_8_;
                    local_10c8._8_8_ = (size_t *)(local_10c8._8_8_ + 8);
                    pRVar9 = (RSA *)daemon_get_rsa(sVar22);
                    if (pRVar9 != (RSA *)0x0) {
                      iVar6 = RSA_sign((int)uVar1,puVar16,(uint)uVar20,local_1038,&local_1090,pRVar9
                                      );
                      expbuf_dispose((expbuf_t *)local_10c8);
                      RSA_free(pRVar9);
                      expbuf_reserve((expbuf_t *)local_10c8,8);
                      *(long *)local_10b8._0_8_ = (long)iVar6;
                      local_10b8._0_8_ = (long *)(local_10b8._0_8_ + 8);
                      uVar4 = local_1090;
                      if (iVar6 != 1) {
                        uVar4 = 0;
                      }
                      expbuf_push_bytes((expbuf_t *)local_10c8,local_1038,(ulong)uVar4);
                      goto LAB_00189c4c;
                    }
                    piVar7 = __errno_location();
                    *piVar7 = 0;
                    warnf("%s: invalid key index:%zu","sign_stub",sVar22);
                    goto LAB_0018a69d;
                  }
                }
              }
            }
            piVar7 = __errno_location();
            *piVar7 = 0;
            pcVar19 = "%s: failed to parse request";
            pcVar18 = "sign_stub";
LAB_0018a6f4:
            warnf(pcVar19,pcVar18);
            goto LAB_0018a69d;
          }
          iVar6 = strcmp(pcVar18,"ecdsa_sign");
          if (iVar6 == 0) {
            local_1090 = 0;
            if (7 < (ulong)(uVar21 - (long)pcVar19)) {
              uVar1 = *(undefined8 *)((long)pvVar8 + 1);
              local_10c8._8_8_ = (long)pvVar8 + 9;
              if (7 < (ulong)(uVar21 - ((long)pvVar8 + 9))) {
                uVar20 = *(ulong *)((long)pvVar8 + 9);
                puVar16 = (uchar *)((long)pvVar8 + 0x11);
                local_10c8._8_8_ = puVar16;
                if (uVar20 <= (ulong)(uVar21 - (long)puVar16)) {
                  local_10c8._8_8_ = puVar16 + uVar20;
                  if (7 < (ulong)(uVar21 - local_10c8._8_8_)) {
                    lVar23 = *(long *)local_10c8._8_8_;
                    local_10c8._8_8_ = (long *)(local_10c8._8_8_ + 8);
                    pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
                    pEVar13 = (EC_KEY *)daemon_vars.keys.ecdsa_keys[lVar23];
                    if (pEVar13 != (EC_KEY *)0x0) {
                      EC_KEY_up_ref(pEVar13);
                      pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
                      iVar6 = ECDSA_sign((int)uVar1,puVar16,(int)uVar20,local_1038,&local_1090,
                                         pEVar13);
                      expbuf_dispose((expbuf_t *)local_10c8);
                      EC_KEY_free(pEVar13);
                      expbuf_reserve((expbuf_t *)local_10c8,8);
                      *(long *)local_10b8._0_8_ = (long)iVar6;
                      local_10b8._0_8_ = (long *)(local_10b8._0_8_ + 8);
                      uVar4 = local_1090;
                      if (iVar6 != 1) {
                        uVar4 = 0;
                      }
                      expbuf_push_bytes((expbuf_t *)local_10c8,local_1038,(ulong)uVar4);
                      _sock_fd = local_1080;
                      goto LAB_00189c4c;
                    }
                    pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
                    piVar7 = __errno_location();
                    *piVar7 = 0;
                    warnf("%s: invalid key index:%zu","ecdsa_sign_stub",lVar23);
                    __fd = (int)local_1080;
                    goto LAB_0018a69d;
                  }
                }
              }
            }
            piVar7 = __errno_location();
            *piVar7 = 0;
            pcVar19 = "%s: failed to parse request";
            pcVar18 = "ecdsa_sign_stub";
            goto LAB_0018a6f4;
          }
          iVar6 = strcmp(pcVar18,"del_ecdsa_key");
          if (iVar6 != 0) {
            iVar6 = strcmp(pcVar18,"load_key");
            if (iVar6 == 0) {
              memset(local_1038,0,0x100);
              pvVar8 = memchr(pcVar19,0,uVar21 - (long)pcVar19);
              if (pvVar8 == (void *)0x0) {
                pcVar19 = "%s: failed to parse request";
                pcVar18 = "load_key_stub";
                goto LAB_0018a6f4;
              }
              local_10c8._8_8_ = (long)pvVar8 + 1;
              local_1068 = fopen(pcVar19,"rt");
              if (local_1068 == (FILE *)0x0) {
                piVar7 = __errno_location();
                strerror_r(*piVar7,(char *)local_1038,0x100);
LAB_0018a163:
                uVar20 = 0xffffffffffffffff;
                local_1098 = (RSA *)0x0;
                local_10a8 = (EC_POINT *)0x0;
                local_10a0 = (char *)0x0;
                lVar23 = 0;
                local_1078 = (EVP_PKEY *)0x0;
LAB_0018a191:
                local_1088 = (BIGNUM *)0x0;
LAB_0018a19a:
                puVar16 = (uchar *)0x0;
              }
              else {
                pEVar10 = PEM_read_PrivateKey(local_1068,(EVP_PKEY **)0x0,(undefined1 *)0x0,
                                              (void *)0x0);
                if (pEVar10 == (EVP_PKEY *)0x0) {
                  builtin_memcpy(local_1038 + 0x10,"the priv",8);
                  uStack_1020 = 0x6b20657461;
                  local_101b = 0x7965;
                  builtin_memcpy(local_1038,"failed to parse ",0x10);
                  goto LAB_0018a163;
                }
                iVar6 = EVP_PKEY_get_base_id(pEVar10);
                local_1078 = pEVar10;
                if (iVar6 != 0x198) {
                  if (iVar6 == 6) {
                    local_1098 = EVP_PKEY_get1_RSA(pEVar10);
                    pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
                    adjust_slots_reserved_size(1,&daemon_vars.keys.rsa_slots);
                    pRVar9 = local_1098;
                    if (daemon_vars.keys.rsa_slots.reserved_size == 0) goto LAB_0018a7bc;
                    uVar20 = 0;
                    puVar17 = (ulong *)daemon_vars.keys.rsa_slots.bita_avail;
                    while (uVar2 = *puVar17, uVar2 == 0) {
                      puVar17 = puVar17 + 1;
                      uVar20 = uVar20 + 0x40;
                      if (daemon_vars.keys.rsa_slots.reserved_size <= uVar20) goto LAB_0018a7bc;
                    }
                    lVar23 = 0;
                    if (uVar2 != 0) {
                      for (; (uVar2 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                      }
                    }
                    uVar20 = uVar20 + lVar23;
                    if (uVar20 == 0xffffffffffffffff) goto LAB_0018a7bc;
                    bVar3 = (byte)lVar23 & 7;
                    daemon_vars.keys.rsa_slots.bita_avail[uVar20 >> 3] =
                         daemon_vars.keys.rsa_slots.bita_avail[uVar20 >> 3] &
                         (-2 << bVar3 | 0xfeU >> 8 - bVar3);
                    daemon_vars.keys.rsa_slots.size = daemon_vars.keys.rsa_slots.size + 1;
                    daemon_vars.keys.keys[uVar20] = (RSA *)local_1098;
                    RSA_up_ref(local_1098);
                    pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
                    RSA_get0_key(pRVar9,&local_1060,&local_1090);
                    local_10a8 = (EC_POINT *)BN_bn2hex((BIGNUM *)CONCAT44(uStack_108c,local_1090));
                    local_10a0 = BN_bn2hex(local_1060);
                    lVar23 = 1;
                  }
                  else {
                    EVP_PKEY_get_base_id();
                    snprintf((char *)local_1038,0x100,"unsupported private key: %d");
                    uVar20 = 0xffffffffffffffff;
                    local_1098 = (RSA *)0x0;
                    local_10a8 = (EC_POINT *)0x0;
                    local_10a0 = (char *)0x0;
                    lVar23 = 0;
                  }
                  goto LAB_0018a191;
                }
                pEVar13 = (EC_KEY *)EVP_PKEY_get0_EC_KEY();
                pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
                adjust_slots_reserved_size(2,&daemon_vars.keys.ecdsa_slots);
                if (daemon_vars.keys.ecdsa_slots.reserved_size == 0) {
LAB_0018a7bc:
                  dief("no available slot for key");
                }
                uVar20 = 0;
                puVar17 = (ulong *)daemon_vars.keys.ecdsa_slots.bita_avail;
                while (uVar2 = *puVar17, uVar2 == 0) {
                  puVar17 = puVar17 + 1;
                  uVar20 = uVar20 + 0x40;
                  if (daemon_vars.keys.ecdsa_slots.reserved_size <= uVar20) goto LAB_0018a7bc;
                }
                lVar23 = 0;
                if (uVar2 != 0) {
                  for (; (uVar2 >> lVar23 & 1) == 0; lVar23 = lVar23 + 1) {
                  }
                }
                uVar20 = uVar20 + lVar23;
                if (uVar20 == 0xffffffffffffffff) goto LAB_0018a7bc;
                bVar3 = (byte)lVar23 & 7;
                daemon_vars.keys.ecdsa_slots.bita_avail[uVar20 >> 3] =
                     daemon_vars.keys.ecdsa_slots.bita_avail[uVar20 >> 3] &
                     (-2 << bVar3 | 0xfeU >> 8 - bVar3);
                daemon_vars.keys.ecdsa_slots.size = daemon_vars.keys.ecdsa_slots.size + 1;
                daemon_vars.keys.ecdsa_keys[uVar20] = (EC_KEY *)pEVar13;
                EC_KEY_up_ref(pEVar13);
                pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
                pEVar14 = EC_KEY_get0_group(pEVar13);
                local_10a8 = EC_KEY_get0_public_key(pEVar13);
                a = BN_new();
                local_1070 = pEVar14;
                pBVar15 = EC_POINT_point2bn(pEVar14,local_10a8,POINT_CONVERSION_COMPRESSED,a,
                                            (BN_CTX *)0x0);
                local_1088 = a;
                if (pBVar15 == (BIGNUM *)0x0) {
                  acStack_1013[0] = ' ';
                  acStack_1013[1] = 'B';
                  acStack_1013[2] = 'I';
                  acStack_1013[3] = 'G';
                  acStack_1013[4] = 'N';
                  acStack_1013[5] = 'U';
                  acStack_1013[6] = 'M';
                  acStack_1013[7] = '\0';
                  uStack_1018 = 0x6f74207965;
                  local_1038[0x10] = 't';
                  local_1038[0x11] = ' ';
                  local_1038[0x12] = 'E';
                  local_1038[0x13] = 'C';
                  local_1038[0x14] = 'D';
                  local_1038[0x15] = 'S';
                  local_1038[0x16] = 'A';
                  local_1038[0x17] = ' ';
                  uStack_1020 = 0x696c627570;
                  local_101b = 0x6b2063;
                  local_1038[0] = 'f';
                  local_1038[1] = 'a';
                  local_1038[2] = 'i';
                  local_1038[3] = 'l';
                  local_1038[4] = 'e';
                  local_1038[5] = 'd';
                  local_1038[6] = ' ';
                  local_1038[7] = 't';
                  local_1038[8] = 'o';
                  local_1038[9] = ' ';
                  local_1038[10] = 'c';
                  local_1038[0xb] = 'o';
                  local_1038[0xc] = 'n';
                  local_1038[0xd] = 'v';
                  local_1038[0xe] = 'e';
                  local_1038[0xf] = 'r';
                  local_1098 = (RSA *)0x0;
                  local_10a8 = (EC_POINT *)0x0;
                  local_10a0 = (char *)0x0;
                  lVar23 = 0;
                  goto LAB_0018a19a;
                }
                puVar16 = (uchar *)BN_bn2hex(a);
                lVar23 = 2;
                local_1098 = (RSA *)0x0;
                local_10a8 = (EC_POINT *)0x0;
                local_10a0 = (char *)0x0;
              }
              expbuf_dispose((expbuf_t *)local_10c8);
              expbuf_reserve((expbuf_t *)local_10c8,8);
              *(long *)local_10b8._0_8_ = lVar23;
              local_10b8._0_8_ = (ulong *)(local_10b8._0_8_ + 8);
              expbuf_reserve((expbuf_t *)local_10c8,8);
              *(ulong *)local_10b8._0_8_ = uVar20;
              local_10b8._0_8_ = local_10b8._0_8_ + 8;
              if (lVar23 == 2) {
                iVar6 = EC_GROUP_get_curve_name(local_1070);
                expbuf_reserve((expbuf_t *)local_10c8,8);
                *(long *)local_10b8._0_8_ = (long)iVar6;
                local_10b8._0_8_ = local_10b8._0_8_ + 8;
                sVar12 = strlen((char *)puVar16);
                sVar22 = sVar12 + 1;
                expbuf_reserve((expbuf_t *)local_10c8,sVar22);
                __src = puVar16;
LAB_0018a312:
                puVar17 = (ulong *)local_10b8._0_8_;
                memcpy((void *)local_10b8._0_8_,__src,sVar22);
                pcVar18 = local_10a0;
              }
              else {
                if ((int)lVar23 != 1) {
                  sVar12 = strlen((char *)local_1038);
                  sVar22 = sVar12 + 1;
                  expbuf_reserve((expbuf_t *)local_10c8,sVar22);
                  __src = local_1038;
                  goto LAB_0018a312;
                }
                __s = local_10a8;
                if (local_10a8 == (EC_POINT *)0x0) {
                  __s = (EC_POINT *)0x22ec0a;
                }
                sVar12 = strlen((char *)__s);
                expbuf_reserve((expbuf_t *)local_10c8,sVar12 + 1);
                uVar21 = local_10b8._0_8_;
                memcpy((void *)local_10b8._0_8_,__s,sVar12 + 1);
                pcVar18 = local_10a0;
                local_10b8._0_8_ = uVar21 + sVar12 + 1;
                pcVar19 = local_10a0;
                if (local_10a0 == (char *)0x0) {
                  pcVar19 = "";
                }
                sVar12 = strlen(pcVar19);
                sVar22 = sVar12 + 1;
                expbuf_reserve((expbuf_t *)local_10c8,sVar22);
                puVar17 = (ulong *)local_10b8._0_8_;
                memcpy((void *)local_10b8._0_8_,pcVar19,sVar22);
              }
              pEVar10 = local_1078;
              local_10b8._0_8_ = (long)puVar17 + sVar22;
              if (local_1098 != (RSA *)0x0) {
                RSA_free(local_1098);
              }
              if (pEVar10 != (EVP_PKEY *)0x0) {
                EVP_PKEY_free(pEVar10);
              }
              if (local_10a8 != (EC_POINT *)0x0) {
                CRYPTO_free(local_10a8);
              }
              if (pcVar18 != (char *)0x0) {
                CRYPTO_free(pcVar18);
              }
              if (puVar16 != (uchar *)0x0) {
                CRYPTO_free(puVar16);
              }
              if (local_1088 != (BIGNUM *)0x0) {
                BN_free(local_1088);
              }
              if (local_1068 != (FILE *)0x0) {
                fclose(local_1068);
              }
              goto LAB_00189c4c;
            }
            iVar6 = strcmp(pcVar18,"del_rsa_key");
            if (iVar6 == 0) {
              if ((ulong)(uVar21 - (long)pcVar19) < 8) {
                piVar7 = __errno_location();
                *piVar7 = 0;
                pcVar19 = "%s: failed to parse request";
                pcVar18 = "del_rsa_key_stub";
                goto LAB_0018a6f4;
              }
              uVar20 = *(ulong *)((long)pvVar8 + 1);
              local_10c8._8_8_ = (long)pvVar8 + 9;
              if ((daemon_vars.keys.keys == (RSA **)0x0) ||
                 (daemon_vars.keys.rsa_slots.reserved_size <= uVar20)) {
                piVar7 = __errno_location();
                *piVar7 = 0;
                pcVar18 = "%s: invalid key index %zu";
              }
              else {
                if ((daemon_vars.keys.rsa_slots.bita_avail[uVar20 >> 3] >> ((uint)uVar20 & 7) & 1)
                    == 0) {
                  pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
                  daemon_vars.keys.rsa_slots.bita_avail[uVar20 >> 3] =
                       daemon_vars.keys.rsa_slots.bita_avail[uVar20 >> 3] |
                       '\x01' << ((byte)uVar20 & 7);
                  daemon_vars.keys.rsa_slots.size = daemon_vars.keys.rsa_slots.size - 1;
                  RSA_free((RSA *)daemon_vars.keys.keys[uVar20]);
                  ppEVar11 = (EC_KEY **)daemon_vars.keys.keys;
                  goto LAB_0018a0df;
                }
                pcVar18 = "%s: index not in use %zu";
              }
              pcVar19 = "del_rsa_key_stub";
              goto LAB_0018a644;
            }
            iVar6 = strcmp(pcVar18,"setuidgid");
            if (iVar6 != 0) {
              pcVar19 = "unknown command:%s";
              goto LAB_0018a6f4;
            }
            iVar6 = setuidgid_stub((expbuf_t *)local_10c8);
            goto LAB_00189c44;
          }
          if ((ulong)(uVar21 - (long)pcVar19) < 8) {
            piVar7 = __errno_location();
            *piVar7 = 0;
            pcVar19 = "%s: failed to parse request";
            pcVar18 = "del_ecdsa_key_stub";
            goto LAB_0018a6f4;
          }
          uVar20 = *(ulong *)((long)pvVar8 + 1);
          local_10c8._8_8_ = (long)pvVar8 + 9;
          if ((daemon_vars.keys.ecdsa_keys == (EC_KEY **)0x0) ||
             (daemon_vars.keys.ecdsa_slots.reserved_size <= uVar20)) {
            piVar7 = __errno_location();
            *piVar7 = 0;
            pcVar18 = "%s: invalid key index %zu";
LAB_0018a5c7:
            pcVar19 = "del_ecdsa_key_stub";
LAB_0018a644:
            warnf(pcVar18,pcVar19,uVar20);
            uVar21 = 0;
          }
          else {
            if ((daemon_vars.keys.ecdsa_slots.bita_avail[uVar20 >> 3] >> ((uint)uVar20 & 7) & 1) !=
                0) {
              pcVar18 = "%s: index not in use %zu";
              goto LAB_0018a5c7;
            }
            pthread_mutex_lock((pthread_mutex_t *)&daemon_vars);
            daemon_vars.keys.ecdsa_slots.bita_avail[uVar20 >> 3] =
                 daemon_vars.keys.ecdsa_slots.bita_avail[uVar20 >> 3] | '\x01' << ((byte)uVar20 & 7)
            ;
            daemon_vars.keys.ecdsa_slots.size = daemon_vars.keys.ecdsa_slots.size - 1;
            EC_KEY_free((EC_KEY *)daemon_vars.keys.ecdsa_keys[uVar20]);
            ppEVar11 = daemon_vars.keys.ecdsa_keys;
LAB_0018a0df:
            _sock_fd = local_1080;
            ((RSA **)ppEVar11)[uVar20] = (RSA *)0x0;
            pthread_mutex_unlock((pthread_mutex_t *)&daemon_vars);
            uVar21 = 1;
          }
          expbuf_dispose((expbuf_t *)local_10c8);
          expbuf_reserve((expbuf_t *)local_10c8,8);
          *(undefined8 *)local_10b8._0_8_ = uVar21;
          local_10b8._0_8_ = (char *)(local_10b8._0_8_ + 8);
        }
LAB_00189c4c:
        iVar6 = expbuf_write((expbuf_t *)local_10c8._8_8_,local_10b8._0_4_);
        if (iVar6 != 0) {
          piVar7 = __errno_location();
          pcVar18 = "write error";
          if (*piVar7 == 0) {
            pcVar18 = "connection closed by client";
          }
          goto LAB_0018a696;
        }
        expbuf_dispose((expbuf_t *)local_10c8);
        iVar6 = expbuf_read((expbuf_t *)local_10c8,(int)_sock_fd);
        pvVar5 = local_1080;
        pvVar8 = local_1080;
      }
      local_1080 = pvVar8;
      piVar7 = __errno_location();
      if (*piVar7 == 0) goto LAB_0018a69d;
      pcVar18 = "read error";
    }
    else {
      pcVar18 = "client authentication failed";
    }
  }
  else {
    pcVar18 = "failed to receive authencication token from client";
  }
LAB_0018a696:
  __fd = (int)_sock_fd;
  warnf(pcVar18);
LAB_0018a69d:
  expbuf_dispose((expbuf_t *)local_10c8);
  close(__fd);
  return (void *)0x0;
}

Assistant:

static void *daemon_conn_thread(void *_sock_fd)
{
    int sock_fd = (int)((char *)_sock_fd - (char *)NULL);
    struct expbuf_t buf = {NULL};
    unsigned char auth_token[NEVERBLEED_AUTH_TOKEN_SIZE];

    /* authenticate */
    if (read_nbytes(sock_fd, &auth_token, sizeof(auth_token)) != 0) {
        warnf("failed to receive authencication token from client");
        goto Exit;
    }
    if (memcmp(auth_token, daemon_vars.nb->auth_token, NEVERBLEED_AUTH_TOKEN_SIZE) != 0) {
        warnf("client authentication failed");
        goto Exit;
    }

    while (1) {
        char *cmd;
        if (expbuf_read(&buf, sock_fd) != 0) {
            if (errno != 0)
                warnf("read error");
            break;
        }
        if ((cmd = expbuf_shift_str(&buf)) == NULL) {
            errno = 0;
            warnf("failed to parse request");
            break;
        }
        if (strcmp(cmd, "priv_enc") == 0) {
            if (priv_enc_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "priv_dec") == 0) {
            if (priv_dec_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "sign") == 0) {
            if (sign_stub(&buf) != 0)
                break;
#if OPENSSL_1_1_API
        } else if (strcmp(cmd, "ecdsa_sign") == 0) {
            if (ecdsa_sign_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "del_ecdsa_key") == 0) {
            if (del_ecdsa_key_stub(&buf) != 0)
                break;
#endif
        } else if (strcmp(cmd, "load_key") == 0) {
            if (load_key_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "del_rsa_key") == 0) {
            if (del_rsa_key_stub(&buf) != 0)
                break;
        } else if (strcmp(cmd, "setuidgid") == 0) {
            if (setuidgid_stub(&buf) != 0)
                break;
        } else {
            warnf("unknown command:%s", cmd);
            break;
        }
        if (expbuf_write(&buf, sock_fd) != 0) {
            warnf(errno != 0 ? "write error" : "connection closed by client");
            break;
        }
        expbuf_dispose(&buf);
    }

Exit:
    expbuf_dispose(&buf);
    close(sock_fd);

    return NULL;
}